

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void dfg_ready_handler(CManager cm,CMConnection conn,void *vmsg,void *client_data,attr_list attrs)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint *__ptr;
  FILE *pFVar4;
  int iVar5;
  __pid_t _Var6;
  pthread_t pVar7;
  timespec ts;
  timespec local_48;
  void *local_38;
  
  *(undefined4 *)((long)client_data + 0x30) = *vmsg;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                   ,0x40b);
  __ptr = *(uint **)((long)client_data + 0x48);
  *(undefined8 *)((long)client_data + 0x48) = 0;
  iVar5 = CMtrace_val[0xd];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,EVdfgVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar4 = (FILE *)cm->CMTrace_file;
      _Var6 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar4,"P%lxT%lx - ",(long)_Var6,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_48);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"ENABLING AUTO STONES, list is %p\n",__ptr);
  }
  fflush((FILE *)cm->CMTrace_file);
  if (__ptr != (uint *)0x0) {
    uVar3 = __ptr[1];
    puVar2 = __ptr;
    local_38 = client_data;
    while (uVar3 != 0xffffffff) {
      iVar5 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar5 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar5 != 0) {
        if (CMtrace_PID != 0) {
          pFVar4 = (FILE *)cm->CMTrace_file;
          _Var6 = getpid();
          pVar7 = pthread_self();
          fprintf(pFVar4,"P%lxT%lx - ",(long)_Var6,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"auto stone %d, period %d sec, %d usec\n",(ulong)*puVar2,
                (ulong)puVar2[1],(ulong)puVar2[2]);
      }
      fflush((FILE *)cm->CMTrace_file);
      INT_EVenable_auto_stone(cm,*puVar2,puVar2[1],puVar2[2]);
      puVar1 = puVar2 + 4;
      puVar2 = puVar2 + 3;
      uVar3 = *puVar1;
    }
    free(__ptr);
    client_data = local_38;
  }
  if (*(int *)((long)client_data + 0x1c) == -1) {
    iVar5 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar4 = (FILE *)cm->CMTrace_file;
        _Var6 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar4,"P%lxT%lx - ",(long)_Var6,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Client DFG %p Node id %d got ready, reconfig done\n",
              client_data,(ulong)*(uint *)((long)client_data + 0x30));
    }
    fflush((FILE *)cm->CMTrace_file);
  }
  else {
    iVar5 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar4 = (FILE *)cm->CMTrace_file;
        _Var6 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar4,"P%lxT%lx - ",(long)_Var6,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Client DFG %p Node id %d is ready, signalling %d\n",
              client_data,(ulong)*(uint *)((long)client_data + 0x30),
              (ulong)*(uint *)((long)client_data + 0x1c));
    }
    fflush((FILE *)cm->CMTrace_file);
    INT_CMCondition_signal(cm,*(int *)((long)client_data + 0x1c));
  }
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x413);
  return;
}

Assistant:

static void
dfg_ready_handler(CManager cm, CMConnection conn, void *vmsg, 
		  void *client_data, attr_list attrs)
{
    EVclient client = client_data;
    EVready_ptr msg =  vmsg;
    (void) conn;
    (void) attrs;
    client->my_node_id = msg->node_id;
    CManager_lock(cm);
    enable_auto_stones(cm, client);
    if (client->ready_condition != -1) {
	CMtrace_out(cm, EVdfgVerbose, "Client DFG %p Node id %d is ready, signalling %d\n", client, client->my_node_id, client->ready_condition);
	INT_CMCondition_signal(cm, client->ready_condition);
    } else {
	CMtrace_out(cm, EVdfgVerbose, "Client DFG %p Node id %d got ready, reconfig done\n", client, client->my_node_id);
    }	
    CManager_unlock(cm);
}